

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void sf2cute::SoundFont::RepairPresetReference
               (SFPreset *preset,
               unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
               *instrument_map)

{
  SFPresetZone *preset_zone_00;
  pointer puVar1;
  unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *preset_zone;
  pointer puVar2;
  
  preset_zone_00 =
       (preset->global_zone_)._M_t.
       super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>.
       _M_t.
       super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
       super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  if (preset_zone_00 != (SFPresetZone *)0x0) {
    RepairPresetZoneReference(preset_zone_00,instrument_map);
  }
  puVar1 = (preset->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (preset->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    RepairPresetZoneReference
              ((puVar2->_M_t).
               super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
               .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl,instrument_map);
  }
  return;
}

Assistant:

void SoundFont::RepairPresetReference(
    SFPreset & preset,
    const std::unordered_map<std::shared_ptr<SFInstrument>,
    std::shared_ptr<SFInstrument>> & instrument_map) {
  // Repair global zone.
  if (preset.has_global_zone()) {
    RepairPresetZoneReference(preset.global_zone(), instrument_map);
  }

  // Repair preset zones.
  for (const auto & preset_zone : preset.zones()) {
    RepairPresetZoneReference(*preset_zone, instrument_map);
  }
}